

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O0

void testing::Mock::RegisterUseByOnCallOrExpectCall(void *mock_obj,char *file,int line)

{
  StateMap *this;
  mapped_type *pmVar1;
  UnitTest *this_00;
  TestInfo *this_01;
  char *pcVar2;
  TestInfo *test_info;
  MockObjectState *state;
  MutexLock l;
  char *pcStack_18;
  int line_local;
  char *file_local;
  void *mock_obj_local;
  
  state._4_4_ = line;
  pcStack_18 = file;
  file_local = (char *)mock_obj;
  internal::GTestMutexLock::GTestMutexLock
            ((GTestMutexLock *)((long)&state + 3),(Mutex *)&internal::g_gmock_mutex);
  this = anon_unknown_6::MockObjectRegistry::states
                   ((MockObjectRegistry *)(anonymous_namespace)::g_mock_object_registry);
  pmVar1 = std::
           map<const_void_*,_testing::(anonymous_namespace)::MockObjectState,_std::less<const_void_*>,_std::allocator<std::pair<const_void_*const,_testing::(anonymous_namespace)::MockObjectState>_>_>
           ::operator[](this,&file_local);
  if (pmVar1->first_used_file == (char *)0x0) {
    pmVar1->first_used_file = pcStack_18;
    pmVar1->first_used_line = state._4_4_;
    this_00 = UnitTest::GetInstance();
    this_01 = UnitTest::current_test_info(this_00);
    if (this_01 != (TestInfo *)0x0) {
      pcVar2 = TestInfo::test_suite_name(this_01);
      std::__cxx11::string::operator=((string *)&pmVar1->first_used_test_suite,pcVar2);
      pcVar2 = TestInfo::name(this_01);
      std::__cxx11::string::operator=((string *)&pmVar1->first_used_test,pcVar2);
    }
  }
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(internal::g_gmock_mutex) {
  internal::MutexLock l(&internal::g_gmock_mutex);
  MockObjectState& state = g_mock_object_registry.states()[mock_obj];
  if (state.first_used_file == nullptr) {
    state.first_used_file = file;
    state.first_used_line = line;
    const TestInfo* const test_info =
        UnitTest::GetInstance()->current_test_info();
    if (test_info != nullptr) {
      state.first_used_test_suite = test_info->test_suite_name();
      state.first_used_test = test_info->name();
    }
  }
}